

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_Emplace_KeyMoveCount_Test::TestBody
          (DenseHashMapMoveTest_Emplace_KeyMoveCount_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  h;
  key_type *in_stack_fffffffffffffe68;
  allocator_type *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  hasher *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int line;
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_stack_fffffffffffffe90;
  Type in_stack_fffffffffffffe9c;
  Type type;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_128;
  Message *in_stack_fffffffffffffee8;
  AssertHelper *in_stack_fffffffffffffef0;
  AssertionResult local_100 [2];
  undefined4 local_dc;
  AssertionResult local_d8;
  uint local_c4;
  undefined4 local_ac;
  AssertionResult local_a8 [3];
  undefined4 local_78;
  undefined4 local_74;
  A local_70 [5];
  libc_allocator_with_realloc<std::pair<const_A,_int>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_A,_int>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffe90,
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                   in_stack_fffffffffffffe80,
                   (key_equal *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe70);
  google::libc_allocator_with_realloc<std::pair<const_A,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  A::A(local_70,0);
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::set_empty_key((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                   *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  A::reset();
  local_74 = 1;
  local_78 = 2;
  google::
  dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
  ::emplace<int,int>((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                      *)in_stack_fffffffffffffe80,
                     (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     (int *)in_stack_fffffffffffffe70);
  local_ac = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (char *)in_stack_fffffffffffffe80,
             (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             (int *)in_stack_fffffffffffffe70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffea0);
    in_stack_fffffffffffffea0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x107cfbf);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,(char *)in_stack_fffffffffffffe90
               ,in_stack_fffffffffffffe8c,(char *)in_stack_fffffffffffffe80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
    testing::Message::~Message((Message *)0x107d01c);
  }
  local_c4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107d08a);
  if (local_c4 == 0) {
    local_dc = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (char *)in_stack_fffffffffffffe80,
               (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
               (int *)in_stack_fffffffffffffe70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe9c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe90 =
           (dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x107d13b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffea0,type,(char *)in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe8c,(char *)in_stack_fffffffffffffe80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
      testing::Message::~Message((Message *)0x107d198);
    }
    local_c4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107d206);
    if (local_c4 == 0) {
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 (char *)in_stack_fffffffffffffe80,
                 (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                 (int *)in_stack_fffffffffffffe70);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffea0);
        in_stack_fffffffffffffe80 =
             (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x107d2b7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffea0,type,(char *)in_stack_fffffffffffffe90,line,
                   (char *)in_stack_fffffffffffffe80);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe70);
        testing::Message::~Message((Message *)0x107d314);
      }
      local_c4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107d37f);
      if (local_c4 == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(line,in_stack_fffffffffffffe88),
                   (char *)in_stack_fffffffffffffe80,
                   (int *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                   (int *)in_stack_fffffffffffffe70);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffea0);
          this_00 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0x107d41e);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffea0,type,(char *)in_stack_fffffffffffffe90,line,
                     (char *)in_stack_fffffffffffffe80);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          testing::internal::AssertHelper::~AssertHelper(this_00);
          testing::Message::~Message((Message *)0x107d46c);
        }
        local_c4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107d4ce);
        if (local_c4 == 0) {
          local_c4 = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::~dense_hash_map((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                     *)0x107d4f3);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, Emplace_KeyMoveCount)
{
    dense_hash_map<A, int, HashA> h;
    h.set_empty_key(A(0));

    A::reset();
    h.emplace(1, 2);

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}